

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterYs<float>,ImPlot::TransformerLogLin>
               (GetterYs<float> *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  ImPlotPlot *pIVar3;
  double dVar4;
  double dVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  int iVar8;
  int iVar9;
  ImPlotContext *gp;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLogLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar6 = GImPlot;
  pIVar3 = GImPlot->CurrentPlot;
  if (((pIVar3->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar8 = getter->Count;
    local_48 = iVar8 + -1;
    fVar12 = *(float *)((long)getter->Ys +
                       (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar4 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar3->XAxis).Range.Min);
    pIVar3 = pIVar6->CurrentPlot;
    dVar5 = (pIVar3->XAxis).Range.Min;
    iVar8 = transformer->YAxis;
    IVar2 = pIVar6->PixelRange[iVar8].Min;
    local_3c.y = (float)(pIVar6->My[iVar8] * ((double)fVar12 - pIVar3->YAxis[iVar8].Range.Min) +
                        (double)IVar2.y);
    local_3c.x = (float)(pIVar6->Mx *
                         (((double)(float)(dVar4 / pIVar6->LogDenX) *
                           ((pIVar3->XAxis).Range.Max - dVar5) + dVar5) - dVar5) + (double)IVar2.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterYs<float>,ImPlot::TransformerLogLin>>
              ((LineStripRenderer<ImPlot::GetterYs<float>,_ImPlot::TransformerLogLin> *)local_58,
               DrawList,&pIVar3->PlotRect);
  }
  else {
    iVar8 = getter->Count;
    fVar12 = *(float *)((long)getter->Ys +
                       (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride);
    dVar4 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar3->XAxis).Range.Min);
    pIVar3 = pIVar6->CurrentPlot;
    dVar5 = (pIVar3->XAxis).Range.Min;
    iVar8 = transformer->YAxis;
    IVar2 = pIVar6->PixelRange[iVar8].Min;
    local_58._4_4_ =
         (float)(pIVar6->My[iVar8] * ((double)fVar12 - pIVar3->YAxis[iVar8].Range.Min) +
                (double)IVar2.y);
    local_58._0_4_ =
         (float)(pIVar6->Mx *
                 (((double)(float)(dVar4 / pIVar6->LogDenX) * ((pIVar3->XAxis).Range.Max - dVar5) +
                  dVar5) - dVar5) + (double)IVar2.x);
    iVar8 = getter->Count;
    if (1 < iVar8) {
      iVar9 = 1;
      do {
        pIVar7 = GImPlot;
        fVar12 = *(float *)((long)getter->Ys +
                           (long)(((getter->Offset + iVar9) % iVar8 + iVar8) % iVar8) *
                           (long)getter->Stride);
        dVar4 = log10(((double)iVar9 * getter->XScale + getter->X0) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar3 = pIVar7->CurrentPlot;
        dVar5 = (pIVar3->XAxis).Range.Min;
        iVar8 = transformer->YAxis;
        IVar2 = pIVar7->PixelRange[iVar8].Min;
        fVar10 = (float)(pIVar7->Mx *
                         (((double)(float)(dVar4 / pIVar7->LogDenX) *
                           ((pIVar3->XAxis).Range.Max - dVar5) + dVar5) - dVar5) + (double)IVar2.x);
        fVar11 = (float)(pIVar7->My[iVar8] * ((double)fVar12 - pIVar3->YAxis[iVar8].Range.Min) +
                        (double)IVar2.y);
        local_60.y = fVar11;
        local_60.x = fVar10;
        pIVar3 = pIVar6->CurrentPlot;
        fVar12 = (float)local_58._4_4_;
        if (fVar11 <= (float)local_58._4_4_) {
          fVar12 = fVar11;
        }
        if ((fVar12 < (pIVar3->PlotRect).Max.y) &&
           (fVar12 = (float)(~-(uint)(fVar11 <= (float)local_58._4_4_) & (uint)fVar11 |
                            local_58._4_4_ & -(uint)(fVar11 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar3->PlotRect).Min.y, *pfVar1 <= fVar12 && fVar12 != *pfVar1)) {
          fVar12 = (float)local_58._0_4_;
          if (fVar10 <= (float)local_58._0_4_) {
            fVar12 = fVar10;
          }
          if ((fVar12 < (pIVar3->PlotRect).Max.x) &&
             (fVar12 = (float)(-(uint)(fVar10 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar10 <= (float)local_58._0_4_) & (uint)fVar10),
             (pIVar3->PlotRect).Min.x <= fVar12 && fVar12 != (pIVar3->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar9 = iVar9 + 1;
        iVar8 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar9 < iVar8);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}